

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tickcounter_linux.c
# Opt level: O2

int tickcounter_get_current_ms(TICK_COUNTER_HANDLE tick_counter,tickcounter_ms_t *current_ms)

{
  LOGGER_LOG p_Var1;
  int64_t iVar2;
  tickcounter_ms_t tVar3;
  int iVar4;
  TICK_COUNTER_INSTANCE *tick_counter_instance;
  
  if (tick_counter == (TICK_COUNTER_HANDLE)0x0 || current_ms == (tickcounter_ms_t *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar4 = 0x38;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/tickcounter_linux.c"
                ,"tickcounter_get_current_ms",0x37,1,"tickcounter failed: Invalid Arguments.");
    }
  }
  else {
    iVar2 = get_time_ms();
    if (iVar2 == -1) {
      iVar4 = 0x3f;
    }
    else {
      tVar3 = iVar2 - tick_counter->init_time_value;
      tick_counter->current_ms = tVar3;
      *current_ms = tVar3;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int tickcounter_get_current_ms(TICK_COUNTER_HANDLE tick_counter, tickcounter_ms_t * current_ms)
{
    int result;

    if (tick_counter == NULL || current_ms == NULL)
    {
        LogError("tickcounter failed: Invalid Arguments.");
        result = MU_FAILURE;
    }
    else
    {
        int64_t time_value = get_time_ms();
        if (time_value == INVALID_TIME_VALUE)
        {
            result = MU_FAILURE;
        }
        else
        {
            TICK_COUNTER_INSTANCE* tick_counter_instance = (TICK_COUNTER_INSTANCE*)tick_counter;
            tick_counter_instance->current_ms = (tickcounter_ms_t) time_value - tick_counter_instance->init_time_value;
            *current_ms = tick_counter_instance->current_ms;
            result = 0;
        }
    }

    return result;
}